

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void NetUpdate(void)

{
  byte bVar1;
  void *__src;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  long lVar19;
  ticcmd_t *basis;
  ulong uVar20;
  ticcmd_t *ucmd;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  size_t __n;
  int iVar29;
  uint uVar30;
  BYTE *cmddata;
  BYTE playerbytes [8];
  BYTE *local_70;
  uint local_68;
  int local_64;
  ulong local_60;
  uint local_58;
  int local_54;
  int local_50;
  uint local_4c;
  long *local_48;
  ulong local_40;
  byte abStack_38 [8];
  ulong uVar18;
  
  if (GC::Threshold <= GC::AllocBytes) {
    GC::Step();
  }
  uVar25 = nettics[0];
  uVar3 = resendto[0];
  if (ticdup != 0) {
    iVar16 = 0;
    iVar4 = (*I_GetTime)(false);
    iVar29 = iVar4 - gametime;
    if (iVar29 == 0 || iVar4 < gametime) {
      gametime = iVar4;
      GetPackets();
      return;
    }
    local_60 = CONCAT44(local_60._4_4_,skiptics);
    iVar27 = skiptics - iVar29;
    bVar13 = skiptics < iVar29;
    bVar2 = skiptics < iVar29;
    skiptics = iVar27;
    if (iVar27 == 0 || bVar2) {
      skiptics = 0;
    }
    gametime = iVar4;
    if (iVar27 < 0 && (iVar27 == 0 || bVar13)) {
      iVar16 = 0;
      local_64 = iVar29;
      while( true ) {
        I_StartTic();
        D_ProcessEvents();
        if ((pauseext != false) || (0x10 < (maketic - gametic) / ticdup)) break;
        G_BuildTiccmd(localcmds + maketic % 0xb4);
        iVar10 = maketic + 1;
        iVar4 = iVar10;
        if (ticdup == 1 || iVar10 == 0) {
LAB_0036c376:
          maketic = iVar4;
          TicSpecial::NewMakeTic(&specials);
        }
        else {
          iVar6 = iVar10 % ticdup;
          if (iVar6 == 0) {
            if (ticdup < 1) {
              iVar6 = 0;
              iVar21 = 0;
              iVar22 = 0;
              iVar23 = 0;
              iVar24 = 0;
              iVar5 = 0;
            }
            else {
              iVar29 = -ticdup;
              iVar5 = 0;
              iVar24 = 0;
              iVar23 = 0;
              iVar22 = 0;
              iVar21 = 0;
              iVar6 = 0;
              do {
                iVar26 = (iVar10 + iVar29) % 0xb4;
                iVar6 = iVar6 + localcmds[iVar26].ucmd.pitch;
                iVar21 = iVar21 + localcmds[iVar26].ucmd.yaw;
                iVar22 = iVar22 + localcmds[iVar26].ucmd.roll;
                iVar23 = iVar23 + localcmds[iVar26].ucmd.forwardmove;
                iVar24 = iVar24 + localcmds[iVar26].ucmd.sidemove;
                iVar5 = iVar5 + localcmds[iVar26].ucmd.upmove;
                iVar29 = iVar29 + 1;
              } while (iVar29 != 0);
            }
            iVar29 = local_64;
            if (0 < ticdup) {
              iVar5 = iVar5 / ticdup;
              iVar24 = iVar24 / ticdup;
              iVar23 = iVar23 / ticdup;
              iVar22 = iVar22 / ticdup;
              iVar21 = iVar21 / ticdup;
              iVar6 = iVar6 / ticdup;
              iVar26 = -ticdup;
              maketic = iVar10;
              do {
                iVar4 = (iVar10 + iVar26) % 0xb4;
                localcmds[iVar4].ucmd.pitch = (short)iVar6;
                localcmds[iVar4].ucmd.yaw = (short)iVar21;
                localcmds[iVar4].ucmd.roll = (short)iVar22;
                localcmds[iVar4].ucmd.forwardmove = (short)iVar23;
                localcmds[iVar4].ucmd.sidemove = (short)iVar24;
                localcmds[iVar4].ucmd.upmove = (short)iVar5;
                iVar26 = iVar26 + 1;
                iVar4 = maketic;
              } while (iVar26 != 0);
            }
            goto LAB_0036c376;
          }
          iVar21 = iVar10;
          iVar4 = maketic;
          while (maketic = iVar21, iVar10 - iVar6 < iVar4) {
            iVar21 = (int)((ulong)((long)(iVar4 + -1) * -0x49f49f49) >> 0x20) + iVar4 + -1;
            localcmds[((iVar21 >> 7) - (iVar21 >> 0x1f)) * -0xb4 + iVar4 + -1].ucmd.buttons =
                 localcmds[((iVar21 >> 7) - (iVar21 >> 0x1f)) * -0xb4 + iVar4 + -1].ucmd.buttons |
                 localcmds[iVar4 % 0xb4].ucmd.buttons;
            iVar21 = maketic;
            iVar4 = iVar4 + -1;
          }
        }
        iVar16 = iVar16 + 1;
        if ((iVar29 < (int)local_60) || (-iVar27 <= iVar16)) break;
      }
    }
    uVar25 = nettics[0];
    uVar3 = resendto[0];
    if (singletics == false) {
      uVar8 = (long)maketic / (long)ticdup & 0xffffffff;
      local_58 = (uint)((long)maketic / (long)ticdup);
      uVar25 = local_58;
      uVar3 = local_58;
      if (demoplayback != true) {
        uVar20 = (long)(maketic - iVar16) / (long)ticdup;
        uVar18 = uVar20 & 0xffffffff;
        uVar17 = (uint)uVar20;
        iVar29 = 0;
        local_68 = 1;
        if ((consoleplayer == Net_Arbitrator) && (NetMode == '\x01')) {
          plVar7 = &DAT_017e5fe8;
          iVar4 = 1;
          lVar11 = 0;
          do {
            if (playeringame[lVar11] == true) {
              iVar29 = 1;
              if ((*plVar7 != 0) && (iVar29 = 0, (*(byte *)(*plVar7 + 0x20) & 0x20) != 0)) {
                *plVar7 = 0;
                iVar29 = 1;
              }
              iVar4 = iVar4 + iVar29;
            }
            lVar11 = lVar11 + 1;
            plVar7 = plVar7 + 0x54;
          } while (lVar11 != 8);
          iVar4 = iVar4 + -2;
          if (doomcom.numnodes < 1) {
            iVar29 = 0;
          }
          else {
            lVar11 = 0;
            piVar15 = playerfornode;
            iVar29 = 0;
            do {
              if (nodejustleft[lVar11] == true) {
                if (iVar4 == 0) {
                  PlayerIsGone((int)lVar11,*piVar15);
                }
                else {
                  iVar29 = iVar29 + 1;
                }
              }
              lVar11 = lVar11 + 1;
              piVar15 = piVar15 + 1;
            } while (lVar11 < doomcom.numnodes);
          }
          local_68 = iVar4 + (uint)(iVar4 == 0);
          uVar8 = (ulong)local_58;
        }
        uVar30 = (uint)uVar8;
        uVar20 = (ulong)(uint)(int)doomcom.numnodes;
        local_54 = iVar29;
        if (0 < doomcom.numnodes) {
          local_40 = (ulong)local_68;
          local_48 = &DAT_017e5fe8;
          uVar9 = 0;
          local_4c = uVar17;
          do {
            if ((nodeingame[uVar9] == true) &&
               ((((NetMode != '\x01' || (consoleplayer == Net_Arbitrator)) || (uVar9 == 0)) ||
                (uVar9 == (uint)nodeforplayer[Net_Arbitrator])))) {
              if ((((int)uVar8 != (int)uVar18) || (0 < resendcount[uVar9])) ||
                 ((remoteresend[uVar9] != false || (nettics[uVar9] == 0)))) {
                uVar28 = (long)maketic / (long)ticdup & 0xffffffff;
                iVar29 = (int)((long)maketic / (long)ticdup);
                doomcom.data[0] = '\0';
                local_50 = resendto[uVar9];
                doomcom.data[1] = (BYTE)local_50;
                uVar25 = 2;
                if (((NetMode == '\x01') && (uVar9 != 0)) && (consoleplayer == Net_Arbitrator)) {
                  if (1 < (int)uVar20) {
                    uVar12 = 1;
                    do {
                      if (nodeingame[uVar12] == true) {
                        uVar14 = (ulong)(uint)nettics[uVar12];
                        if ((int)uVar28 <= nettics[uVar12]) {
                          uVar14 = uVar28;
                        }
                        if (uVar9 != uVar12) {
                          uVar28 = uVar14;
                        }
                      }
                      iVar29 = (int)uVar28;
                      uVar12 = uVar12 + 1;
                    } while ((uVar20 & 0xffffffff) != uVar12);
                  }
                  doomcom.data[2] = (BYTE)iVar29;
                  uVar25 = 3;
                }
                iVar16 = iVar29 - local_50;
                iVar4 = 0;
                if (0 < iVar16) {
                  iVar4 = iVar16;
                }
                if (0x24 < iVar16) {
                  I_Error("NetUpdate: Node %d missed too many tics");
                }
                if (net_extratic.Value == 2) {
                  iVar29 = nettics[uVar9];
                }
                else if (net_extratic.Value == 1) {
                  if (iVar29 < 2) {
                    iVar29 = 1;
                  }
                  iVar29 = iVar29 + -1;
                }
                resendto[uVar9] = iVar29;
                if ((((0 < iVar16) || ((int)uVar8 != (int)uVar18)) || (remoteresend[uVar9] != false)
                    ) || (nettics[uVar9] == 0)) {
                  if (remoteresend[uVar9] == true) {
                    doomcom.data[0] = doomcom.data[0] | 0x40;
                    uVar20 = (ulong)uVar25;
                    uVar25 = uVar25 + 1;
                    doomcom.data[uVar20] = (BYTE)nettics[uVar9];
                  }
                  if (iVar16 < 3) {
                    doomcom.data[0] = doomcom.data[0] | (byte)iVar4;
                  }
                  else {
                    doomcom.data[0] = doomcom.data[0] | 3;
                    uVar20 = (ulong)uVar25;
                    uVar25 = uVar25 + 1;
                    doomcom.data[uVar20] = (byte)iVar4 - 3;
                  }
                  if (0 < local_54) {
                    doomcom.data[0] = doomcom.data[0] | 8;
                    uVar20 = (ulong)uVar25;
                    uVar25 = uVar25 + 1;
                    doomcom.data[uVar20] = (BYTE)local_54;
                    if (0 < doomcom.numnodes) {
                      piVar15 = playerfornode;
                      lVar11 = 0;
                      do {
                        if (nodejustleft[lVar11] == true) {
                          lVar19 = (long)(int)uVar25;
                          uVar25 = uVar25 + 1;
                          doomcom.data[lVar19] = (BYTE)*piVar15;
                        }
                        lVar11 = lVar11 + 1;
                        piVar15 = piVar15 + 1;
                      } while (lVar11 < doomcom.numnodes);
                    }
                  }
                  doomcom.data[(int)uVar25] = (BYTE)((maketic - (iVar4 + gametic)) / ticdup);
                  iVar29 = uVar25 + 1;
                  if (0 < iVar16) {
                    if ((uVar9 != 0 && 1 < (int)local_68) &&
                       (uVar8 = (ulong)(uint)consoleplayer, consoleplayer == Net_Arbitrator)) {
                      doomcom.data[0] = doomcom.data[0] | 0x10;
                      iVar29 = uVar25 + 2;
                      doomcom.data[(long)(int)uVar25 + 1] = (BYTE)local_68;
                      if (NetMode == '\x01') {
                        iVar4 = 1;
                        uVar20 = 0;
                        plVar7 = local_48;
                        do {
                          if (playeringame[uVar20] == true) {
                            if (*plVar7 != 0) {
                              if ((*(byte *)(*plVar7 + 0x20) & 0x20) == 0) goto LAB_0036ca4e;
                              *plVar7 = 0;
                            }
                            if ((uVar8 != uVar20) && (uVar20 != (uint)playerfornode[uVar9])) {
                              lVar11 = (long)iVar4;
                              iVar4 = iVar4 + 1;
                              abStack_38[lVar11] = (byte)uVar20;
                              lVar11 = (long)iVar29;
                              iVar29 = iVar29 + 1;
                              doomcom.data[lVar11] = (byte)uVar20;
                            }
                          }
LAB_0036ca4e:
                          uVar20 = uVar20 + 1;
                          plVar7 = plVar7 + 0x54;
                        } while (uVar20 != 8);
                      }
                    }
                    local_70 = doomcom.data + iVar29;
                    if (0 < (int)local_68) {
                      if (iVar16 < 2) {
                        iVar16 = 1;
                      }
                      local_60 = 0;
                      iVar29 = local_50;
                      iVar4 = iVar16;
                      do {
                        iVar27 = ticdup;
                        iVar10 = iVar29 % 0x24;
                        if (local_60 == 0) {
                          iVar6 = (ticdup * iVar29) % 0xb4;
                          WriteWord(localcmds[iVar6].consistancy,&local_70);
                          if (specials.used[iVar10] != 0) {
                            memcpy(local_70,specials.streams[iVar10],specials.used[iVar10]);
                            local_70 = local_70 + specials.used[iVar10];
                          }
                          uVar25 = (iVar27 * (iVar29 + -1)) % 0xb4;
                          ucmd = localcmds + iVar6;
                          basis = localcmds + (int)uVar25;
LAB_0036cc87:
                          if ((int)uVar25 < 0) {
                            basis = (ticcmd_t *)0x0;
                          }
                          WriteUserCmdMessage(&ucmd->ucmd,&basis->ucmd,&local_70);
                        }
                        else if (uVar9 != 0) {
                          bVar1 = abStack_38[local_60];
                          uVar8 = (ulong)bVar1;
                          lVar11 = (long)iVar10;
                          local_64 = iVar29 + -1;
                          WriteWord(*(short *)(uVar8 * 0x2d0 + 0x17dcfa0 + lVar11 * 0x14),&local_70)
                          ;
                          iVar27 = (uint)bVar1 * 8 + (uint)bVar1;
                          __n = (size_t)*(int *)((long)&NetSpecs[0][lVar11].m_Len +
                                                (ulong)(uint)(iVar27 * 0x40));
                          __src = *(void **)((long)&NetSpecs[0][lVar11].m_Data +
                                            (ulong)(uint)(iVar27 * 0x40));
                          if (__src != (void *)0x0 && __n != 0) {
                            memcpy(local_70,__src,__n);
                            local_70 = local_70 + __n;
                          }
                          uVar25 = ((local_64 / 0x24) * -0x24 + iVar29) - 1;
                          ucmd = netcmds[uVar8] + lVar11;
                          basis = netcmds[uVar8] + uVar25;
                          goto LAB_0036cc87;
                        }
                        iVar4 = iVar4 + -1;
                        iVar29 = iVar29 + 1;
                      } while ((iVar4 != 0) ||
                              (local_60 = local_60 + 1, iVar29 = local_50, iVar4 = iVar16,
                              local_60 != local_40));
                    }
                    iVar29 = (int)local_70 + -0x17d78c4;
                    uVar8 = (ulong)local_58;
                    uVar18 = (ulong)local_4c;
                  }
                  HSendPacket((int)uVar9,iVar29);
                }
              }
            }
            uVar30 = (uint)uVar8;
            uVar17 = (uint)uVar18;
            uVar9 = uVar9 + 1;
            uVar20 = (ulong)doomcom.numnodes;
          } while ((long)uVar9 < (long)uVar20);
        }
        GetPackets();
        uVar25 = nettics[0];
        uVar3 = resendto[0];
        if ((uVar30 != uVar17) && (consoleplayer != Net_Arbitrator)) {
          if (NetMode == '\0') {
            iVar29 = 0;
            if (net_ticbalance.Value == true) {
              lVar11 = 0;
              iVar4 = 0;
              iVar16 = 0;
              do {
                iVar4 = iVar4 + *(int *)((long)netdelay[nodeforplayer[Net_Arbitrator]] + lVar11);
                iVar16 = iVar16 + *(int *)((long)netdelay[0] + lVar11);
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0x90);
              iVar4 = iVar4 / 0x24;
              iVar16 = iVar16 / 0x24;
              if (iVar16 < iVar4) {
                iVar29 = (iVar4 + iVar16) / 2;
                lastaverage = iVar29;
              }
              else {
                iVar29 = lastaverage;
                if (0 < lastaverage && iVar4 + 2 < iVar16) {
                  iVar29 = lastaverage + -1;
                  lastaverage = iVar29;
                }
              }
            }
            mastertics = iVar29 + nettics[nodeforplayer[Net_Arbitrator]];
          }
          if ((nettics[0] <= mastertics) && (gametime = gametime + -1, debugfile != (FILE *)0x0)) {
            fputc(0x2d,(FILE *)debugfile);
          }
          bVar13 = 3 < oldnettics - mastertics;
          if (NetMode != '\x01') {
            bVar13 = mastertics < oldnettics;
          }
          frameskip[maketic / ticdup & 3] = (uint)bVar13;
          if ((((frameskip[0] != 0) && (frameskip[1] != 0)) && (frameskip[2] != 0)) &&
             ((frameskip[3] != 0 && (skiptics = 1, debugfile != (FILE *)0x0)))) {
            fputc(0x2b,(FILE *)debugfile);
          }
          oldnettics = nettics[0];
          uVar25 = nettics[0];
          uVar3 = resendto[0];
        }
      }
    }
  }
  resendto[0] = uVar3;
  nettics[0] = uVar25;
  return;
}

Assistant:

TicSpecial &operator << (float it)
	{
		if (streamptr)
		{
			CheckSpace (4);
			WriteFloat (it, &streamptr);
		}
		return *this;
	}